

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::CompareEdgeDirections(S2Point *a0,S2Point *a1,S2Point *b0,S2Point *b1)

{
  bool bVar1;
  int iVar2;
  longdouble lVar3;
  Vector3_xf local_e8;
  undefined1 local_b8 [16];
  longdouble local_a8;
  longdouble local_98;
  Vector3_xf local_88;
  Vector3_xf local_58;
  
  local_b8._0_4_ = *(undefined4 *)a1->c_;
  local_b8._4_4_ = *(uint *)((long)a1->c_ + 4) ^ 0x80000000;
  local_b8._12_4_ = *(uint *)((long)a1->c_ + 0xc) ^ 0x80000000;
  local_b8._8_2_ = (undefined2)*(undefined4 *)(a1->c_ + 1);
  local_b8._10_2_ = (undefined2)((uint)*(undefined4 *)(a1->c_ + 1) >> 0x10);
  local_a8._0_8_ = -a1->c_[2];
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)a0,(D *)local_b8);
  if (bVar1) {
    local_a8._0_8_ = -b1->c_[2];
    local_b8._0_4_ = *(undefined4 *)b1->c_;
    local_b8._4_4_ = *(uint *)((long)b1->c_ + 4) ^ 0x80000000;
    local_b8._12_4_ = *(uint *)((long)b1->c_ + 0xc) ^ 0x80000000;
    local_b8._8_2_ = (undefined2)*(undefined4 *)(b1->c_ + 1);
    local_b8._10_2_ = (undefined2)((uint)*(undefined4 *)(b1->c_ + 1) >> 0x10);
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                      ((BasicVector<Vector3,_double,_3UL> *)b0,(D *)local_b8);
    if (bVar1) {
      iVar2 = TriageCompareEdgeDirections<double>(a0,a1,b0,b1);
      if (iVar2 == 0) {
        bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          ((BasicVector<Vector3,_double,_3UL> *)a0,a1);
        iVar2 = 0;
        if ((!bVar1) &&
           (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                              ((BasicVector<Vector3,_double,_3UL> *)b0,b1), !bVar1)) {
          lVar3 = (longdouble)a0->c_[0];
          local_a8 = (longdouble)a0->c_[1];
          local_98 = (longdouble)a0->c_[2];
          local_b8._0_4_ = SUB104(lVar3,0);
          local_b8._4_4_ = (undefined4)((unkuint10)lVar3 >> 0x20);
          local_b8._8_2_ = (undefined2)((unkuint10)lVar3 >> 0x40);
          local_e8.c_[1]._0_10_ = (BADTYPE)a1->c_[1];
          local_e8.c_[2]._0_10_ = (BADTYPE)a1->c_[2];
          local_e8.c_[0]._0_8_ = SUB108((longdouble)a1->c_[0],0);
          local_e8.c_[0].bn_.bn_._0_2_ = (undefined2)((unkuint10)(longdouble)a1->c_[0] >> 0x40);
          local_58.c_[0]._0_10_ = (BADTYPE)b0->c_[0];
          local_58.c_[1]._0_10_ = (BADTYPE)b0->c_[1];
          local_58.c_[2]._0_10_ = (BADTYPE)b0->c_[2];
          local_88.c_[0]._0_10_ = (BADTYPE)b1->c_[0];
          local_88.c_[1]._0_10_ = (BADTYPE)b1->c_[1];
          local_88.c_[2]._0_10_ = (BADTYPE)b1->c_[2];
          iVar2 = TriageCompareEdgeDirections<long_double>
                            ((Vector3<long_double> *)local_b8,(Vector3<long_double> *)&local_e8,
                             (Vector3<long_double> *)&local_58,(Vector3<long_double> *)&local_88);
          if (iVar2 == 0) {
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (local_b8,(BasicVector<Vector3,ExactFloat,3ul> *)a0);
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (&local_e8,(BasicVector<Vector3,ExactFloat,3ul> *)a1);
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (&local_58,(BasicVector<Vector3,ExactFloat,3ul> *)b0);
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (&local_88,(BasicVector<Vector3,ExactFloat,3ul> *)b1);
            iVar2 = ExactCompareEdgeDirections((Vector3_xf *)local_b8,&local_e8,&local_58,&local_88)
            ;
            Vector3<ExactFloat>::~Vector3(&local_88);
            Vector3<ExactFloat>::~Vector3(&local_58);
            Vector3<ExactFloat>::~Vector3(&local_e8);
            Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)local_b8);
          }
        }
      }
      return iVar2;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,800,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)CONCAT62(local_e8.c_[0].bn_.bn_._2_6_,local_e8.c_[0].bn_.bn_._0_2_),
                    "Check failed: (b0) != (-b1) ");
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,799,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)CONCAT62(local_e8.c_[0].bn_.bn_._2_6_,local_e8.c_[0].bn_.bn_._0_2_),
                    "Check failed: (a0) != (-a1) ");
  }
  abort();
}

Assistant:

int CompareEdgeDirections(const S2Point& a0, const S2Point& a1,
                          const S2Point& b0, const S2Point& b1) {
  // Check that no edge consists of antipodal points.  (This catches the most
  // common case -- the full test is in ExactCompareEdgeDirections.)
  S2_DCHECK_NE(a0, -a1);
  S2_DCHECK_NE(b0, -b1);

  int sign = TriageCompareEdgeDirections(a0, a1, b0, b1);
  if (sign != 0) return sign;

  // Optimization for the case where either edge is degenerate.
  if (a0 == a1 || b0 == b1) return 0;

  sign = TriageCompareEdgeDirections(ToLD(a0), ToLD(a1), ToLD(b0), ToLD(b1));
  if (sign != 0) return sign;
  return ExactCompareEdgeDirections(ToExact(a0), ToExact(a1),
                                    ToExact(b0), ToExact(b1));
}